

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

void __thiscall CPU::MOS6502::State::Registers::Registers(Registers *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  (this->super_StructImpl<CPU::MOS6502::State::Registers>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005a9930;
  if (Reflection::StructImpl<CPU::MOS6502::State::Registers>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"program_counter","");
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->program_counter,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"stack_pointer","");
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->stack_pointer,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"flags","");
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->flags,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"a","");
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->a,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"x","");
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->x,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"y","");
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->y,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State::Registers::Registers() {
	if(needs_declare()) {
		DeclareField(program_counter);
		DeclareField(stack_pointer);
		DeclareField(flags);
		DeclareField(a);
		DeclareField(x);
		DeclareField(y);
	}
}